

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

stbi_uc * stbi__resample_row_hv_2_simd(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  stbi_uc *psVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  unkuint9 Var20;
  undefined1 auVar21 [11];
  undefined1 auVar22 [15];
  unkuint9 Var23;
  undefined1 auVar24 [11];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  long lVar29;
  long lVar30;
  stbi_uc sVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  short sVar44;
  ushort uVar45;
  short sVar49;
  ushort uVar50;
  short sVar51;
  ushort uVar52;
  short sVar53;
  ushort uVar54;
  short sVar55;
  ushort uVar56;
  short sVar57;
  ushort uVar58;
  short sVar59;
  ushort uVar60;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar61;
  ushort uVar62;
  
  bVar4 = *in_near;
  if (w == 1) {
    sVar31 = (stbi_uc)((uint)bVar4 + (uint)bVar4 * 2 + (uint)*in_far + 2 >> 2);
    out[1] = sVar31;
    *out = sVar31;
    return out;
  }
  iVar32 = (uint)*in_far + (uint)bVar4 + (uint)bVar4 * 2;
  uVar33 = w - 1U & 0xfffffff8;
  if ((int)uVar33 < 1) {
    uVar34 = 0;
    iVar35 = iVar32;
  }
  else {
    uVar34 = 0;
    iVar35 = iVar32;
    do {
      uVar2 = *(ulong *)(in_far + uVar34);
      uVar3 = *(ulong *)(in_near + uVar34);
      auVar5._8_6_ = 0;
      auVar5._0_8_ = uVar2;
      auVar5[0xe] = (char)(uVar2 >> 0x38);
      auVar7._8_4_ = 0;
      auVar7._0_8_ = uVar2;
      auVar7[0xc] = (char)(uVar2 >> 0x30);
      auVar7._13_2_ = auVar5._13_2_;
      auVar9._8_4_ = 0;
      auVar9._0_8_ = uVar2;
      auVar9._12_3_ = auVar7._12_3_;
      auVar11._8_2_ = 0;
      auVar11._0_8_ = uVar2;
      auVar11[10] = (char)(uVar2 >> 0x28);
      auVar11._11_4_ = auVar9._11_4_;
      auVar13._8_2_ = 0;
      auVar13._0_8_ = uVar2;
      auVar13._10_5_ = auVar11._10_5_;
      auVar15[8] = (char)(uVar2 >> 0x20);
      auVar15._0_8_ = uVar2;
      auVar15._9_6_ = auVar13._9_6_;
      auVar19._7_8_ = 0;
      auVar19._0_7_ = auVar15._8_7_;
      Var20 = CONCAT81(SUB158(auVar19 << 0x40,7),(char)(uVar2 >> 0x18));
      auVar25._9_6_ = 0;
      auVar25._0_9_ = Var20;
      auVar21._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar21[0] = (char)(uVar2 >> 0x10);
      auVar26._11_4_ = 0;
      auVar26._0_11_ = auVar21;
      auVar17[2] = (char)(uVar2 >> 8);
      auVar17._0_2_ = (ushort)uVar2;
      auVar17._3_12_ = SUB1512(auVar26 << 0x20,3);
      auVar6._8_6_ = 0;
      auVar6._0_8_ = uVar3;
      auVar6[0xe] = (char)(uVar3 >> 0x38);
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar3;
      auVar8[0xc] = (char)(uVar3 >> 0x30);
      auVar8._13_2_ = auVar6._13_2_;
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar3;
      auVar10._12_3_ = auVar8._12_3_;
      auVar12._8_2_ = 0;
      auVar12._0_8_ = uVar3;
      auVar12[10] = (char)(uVar3 >> 0x28);
      auVar12._11_4_ = auVar10._11_4_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar3;
      auVar14._10_5_ = auVar12._10_5_;
      auVar16[8] = (char)(uVar3 >> 0x20);
      auVar16._0_8_ = uVar3;
      auVar16._9_6_ = auVar14._9_6_;
      auVar22._7_8_ = 0;
      auVar22._0_7_ = auVar16._8_7_;
      Var23 = CONCAT81(SUB158(auVar22 << 0x40,7),(char)(uVar3 >> 0x18));
      auVar27._9_6_ = 0;
      auVar27._0_9_ = Var23;
      auVar24._1_10_ = SUB1510(auVar27 << 0x30,5);
      auVar24[0] = (char)(uVar3 >> 0x10);
      auVar28._11_4_ = 0;
      auVar28._0_11_ = auVar24;
      auVar18[2] = (char)(uVar3 >> 8);
      auVar18._0_2_ = (ushort)uVar3;
      auVar18._3_12_ = SUB1512(auVar28 << 0x20,3);
      auVar48._0_2_ = (ushort)uVar3 & 0xff;
      auVar48._2_13_ = auVar18._2_13_;
      auVar48[0xf] = 0;
      auVar46 = psllw(auVar48,2);
      auVar47._0_2_ = auVar46._0_2_ + (((ushort)uVar2 & 0xff) - auVar48._0_2_);
      auVar47._2_2_ = auVar46._2_2_ + (auVar17._2_2_ - auVar18._2_2_);
      auVar47._4_2_ = auVar46._4_2_ + (auVar21._0_2_ - auVar24._0_2_);
      auVar47._6_2_ = auVar46._6_2_ + ((short)Var20 - (short)Var23);
      auVar47._8_2_ = auVar46._8_2_ + (auVar15._8_2_ - auVar16._8_2_);
      auVar47._10_2_ = auVar46._10_2_ + (auVar11._10_2_ - auVar12._10_2_);
      auVar47._12_2_ = auVar46._12_2_ + (auVar7._12_2_ - auVar8._12_2_);
      auVar47._14_2_ = auVar46._14_2_ + ((auVar5._13_2_ >> 8) - (auVar6._13_2_ >> 8));
      auVar48 = psllw(auVar47,2);
      sVar44 = auVar48._0_2_ + 8;
      sVar49 = auVar48._2_2_ + 8;
      sVar51 = auVar48._4_2_ + 8;
      sVar53 = auVar48._6_2_ + 8;
      sVar55 = auVar48._8_2_ + 8;
      sVar57 = auVar48._10_2_ + 8;
      sVar59 = auVar48._12_2_ + 8;
      sVar61 = auVar48._14_2_ + 8;
      uVar45 = (ushort)(((short)iVar35 - auVar47._0_2_) + sVar44) >> 4;
      uVar50 = (ushort)((auVar47._2_2_ - auVar47._0_2_) + sVar44) >> 4;
      uVar52 = (ushort)((auVar47._0_2_ - auVar47._2_2_) + sVar49) >> 4;
      uVar54 = (ushort)((auVar47._4_2_ - auVar47._2_2_) + sVar49) >> 4;
      uVar56 = (ushort)((auVar47._2_2_ - auVar47._4_2_) + sVar51) >> 4;
      uVar58 = (ushort)((auVar47._6_2_ - auVar47._4_2_) + sVar51) >> 4;
      uVar60 = (ushort)((auVar47._4_2_ - auVar47._6_2_) + sVar53) >> 4;
      uVar62 = (ushort)((auVar47._8_2_ - auVar47._6_2_) + sVar53) >> 4;
      uVar36 = (ushort)((auVar47._6_2_ - auVar47._8_2_) + sVar55) >> 4;
      uVar37 = (ushort)((auVar47._10_2_ - auVar47._8_2_) + sVar55) >> 4;
      uVar38 = (ushort)((auVar47._8_2_ - auVar47._10_2_) + sVar57) >> 4;
      uVar39 = (ushort)((auVar47._12_2_ - auVar47._10_2_) + sVar57) >> 4;
      uVar40 = (ushort)((auVar47._10_2_ - auVar47._12_2_) + sVar59) >> 4;
      uVar41 = (ushort)((auVar47._14_2_ - auVar47._12_2_) + sVar59) >> 4;
      uVar42 = (ushort)((auVar47._12_2_ - auVar47._14_2_) + sVar61) >> 4;
      uVar43 = (ushort)((((ushort)in_far[uVar34 + 8] +
                         (ushort)in_near[uVar34 + 8] + (ushort)in_near[uVar34 + 8] * 2) -
                        auVar47._14_2_) + sVar61) >> 4;
      psVar1 = out + uVar34 * 2;
      *psVar1 = (uVar45 != 0) * (uVar45 < 0x100) * (char)uVar45 - (0xff < uVar45);
      psVar1[1] = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
      psVar1[2] = (uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52);
      psVar1[3] = (uVar54 != 0) * (uVar54 < 0x100) * (char)uVar54 - (0xff < uVar54);
      psVar1[4] = (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
      psVar1[5] = (uVar58 != 0) * (uVar58 < 0x100) * (char)uVar58 - (0xff < uVar58);
      psVar1[6] = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
      psVar1[7] = (uVar62 != 0) * (uVar62 < 0x100) * (char)uVar62 - (0xff < uVar62);
      psVar1[8] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
      psVar1[9] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
      psVar1[10] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
      psVar1[0xb] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
      psVar1[0xc] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
      psVar1[0xd] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
      psVar1[0xe] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
      psVar1[0xf] = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
      lVar29 = uVar34 + 7;
      lVar30 = uVar34 + 7;
      uVar34 = uVar34 + 8;
      iVar35 = (uint)in_far[lVar30] + (uint)in_near[lVar29] + (uint)in_near[lVar29] * 2;
    } while (uVar34 < uVar33);
    iVar32 = (uint)in_near[uVar34] + (uint)in_near[uVar34] * 2 + (uint)in_far[uVar34];
  }
  out[(uVar34 & 0xffffffff) * 2] = (stbi_uc)(iVar35 + iVar32 * 3 + 8U >> 4);
  if ((int)((uint)uVar34 | 1) < w) {
    uVar34 = (uVar34 & 0xffffffff) + 1;
    iVar35 = iVar32;
    do {
      iVar32 = (uint)in_far[uVar34] + (uint)in_near[uVar34] + (uint)in_near[uVar34] * 2;
      out[uVar34 * 2 + -1] = (stbi_uc)(iVar35 * 3 + iVar32 + 8U >> 4);
      out[uVar34 * 2] = (stbi_uc)(iVar35 + iVar32 * 3 + 8U >> 4);
      uVar34 = uVar34 + 1;
      iVar35 = iVar32;
    } while ((uint)w != uVar34);
  }
  out[(long)w * 2 + -1] = (stbi_uc)(iVar32 + 2U >> 2);
  return out;
}

Assistant:

static stbi_uc *stbi__resample_row_hv_2_simd(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // need to generate 2x2 samples for every one in input
   int i=0,t0,t1;

   if (w == 1) {
      out[0] = out[1] = stbi__div4(3*in_near[0] + in_far[0] + 2);
      return out;
   }

   t1 = 3*in_near[0] + in_far[0];
   // process groups of 8 pixels for as long as we can.
   // note we can't handle the last pixel in a row in this loop
   // because we need to handle the filter boundary conditions.
   for (; i < ((w-1) & ~7); i += 8) {
#if defined(STBI_SSE2)
      // load and perform the vertical filtering pass
      // this uses 3*x + y = 4*x + (y - x)
      __m128i zero  = _mm_setzero_si128();
      __m128i farb  = _mm_loadl_epi64((__m128i *) (in_far + i));
      __m128i nearb = _mm_loadl_epi64((__m128i *) (in_near + i));
      __m128i farw  = _mm_unpacklo_epi8(farb, zero);
      __m128i nearw = _mm_unpacklo_epi8(nearb, zero);
      __m128i diff  = _mm_sub_epi16(farw, nearw);
      __m128i nears = _mm_slli_epi16(nearw, 2);
      __m128i curr  = _mm_add_epi16(nears, diff); // current row

      // horizontal filter works the same based on shifted vers of current
      // row. "prev" is current row shifted right by 1 pixel; we need to
      // insert the previous pixel value (from t1).
      // "next" is current row shifted left by 1 pixel, with first pixel
      // of next block of 8 pixels added in.
      __m128i prv0 = _mm_slli_si128(curr, 2);
      __m128i nxt0 = _mm_srli_si128(curr, 2);
      __m128i prev = _mm_insert_epi16(prv0, t1, 0);
      __m128i next = _mm_insert_epi16(nxt0, 3*in_near[i+8] + in_far[i+8], 7);

      // horizontal filter, polyphase implementation since it's convenient:
      // even pixels = 3*cur + prev = cur*4 + (prev - cur)
      // odd  pixels = 3*cur + next = cur*4 + (next - cur)
      // note the shared term.
      __m128i bias  = _mm_set1_epi16(8);
      __m128i curs = _mm_slli_epi16(curr, 2);
      __m128i prvd = _mm_sub_epi16(prev, curr);
      __m128i nxtd = _mm_sub_epi16(next, curr);
      __m128i curb = _mm_add_epi16(curs, bias);
      __m128i even = _mm_add_epi16(prvd, curb);
      __m128i odd  = _mm_add_epi16(nxtd, curb);

      // interleave even and odd pixels, then undo scaling.
      __m128i int0 = _mm_unpacklo_epi16(even, odd);
      __m128i int1 = _mm_unpackhi_epi16(even, odd);
      __m128i de0  = _mm_srli_epi16(int0, 4);
      __m128i de1  = _mm_srli_epi16(int1, 4);

      // pack and write output
      __m128i outv = _mm_packus_epi16(de0, de1);
      _mm_storeu_si128((__m128i *) (out + i*2), outv);
#elif defined(STBI_NEON)
      // load and perform the vertical filtering pass
      // this uses 3*x + y = 4*x + (y - x)
      uint8x8_t farb  = vld1_u8(in_far + i);
      uint8x8_t nearb = vld1_u8(in_near + i);
      int16x8_t diff  = vreinterpretq_s16_u16(vsubl_u8(farb, nearb));
      int16x8_t nears = vreinterpretq_s16_u16(vshll_n_u8(nearb, 2));
      int16x8_t curr  = vaddq_s16(nears, diff); // current row

      // horizontal filter works the same based on shifted vers of current
      // row. "prev" is current row shifted right by 1 pixel; we need to
      // insert the previous pixel value (from t1).
      // "next" is current row shifted left by 1 pixel, with first pixel
      // of next block of 8 pixels added in.
      int16x8_t prv0 = vextq_s16(curr, curr, 7);
      int16x8_t nxt0 = vextq_s16(curr, curr, 1);
      int16x8_t prev = vsetq_lane_s16(t1, prv0, 0);
      int16x8_t next = vsetq_lane_s16(3*in_near[i+8] + in_far[i+8], nxt0, 7);

      // horizontal filter, polyphase implementation since it's convenient:
      // even pixels = 3*cur + prev = cur*4 + (prev - cur)
      // odd  pixels = 3*cur + next = cur*4 + (next - cur)
      // note the shared term.
      int16x8_t curs = vshlq_n_s16(curr, 2);
      int16x8_t prvd = vsubq_s16(prev, curr);
      int16x8_t nxtd = vsubq_s16(next, curr);
      int16x8_t even = vaddq_s16(curs, prvd);
      int16x8_t odd  = vaddq_s16(curs, nxtd);

      // undo scaling and round, then store with even/odd phases interleaved
      uint8x8x2_t o;
      o.val[0] = vqrshrun_n_s16(even, 4);
      o.val[1] = vqrshrun_n_s16(odd,  4);
      vst2_u8(out + i*2, o);
#endif

      // "previous" value for next iter
      t1 = 3*in_near[i+7] + in_far[i+7];
   }

   t0 = t1;
   t1 = 3*in_near[i] + in_far[i];
   out[i*2] = stbi__div16(3*t1 + t0 + 8);

   for (++i; i < w; ++i) {
      t0 = t1;
      t1 = 3*in_near[i]+in_far[i];
      out[i*2-1] = stbi__div16(3*t0 + t1 + 8);
      out[i*2  ] = stbi__div16(3*t1 + t0 + 8);
   }
   out[w*2-1] = stbi__div4(t1+2);

   STBI_NOTUSED(hs);

   return out;
}